

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

void __thiscall
QPixmapStyle::drawPanelItemViewItem
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *widget)

{
  long lVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  long in_FS_OFFSET;
  ControlDescriptor local_8c;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  ControlPixmap cp;
  anon_union_24_3_e3d07ef4_for_data local_68 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  cp = ID_Separator;
  local_8c = ID_Selected;
  if (widget != (QWidget *)0x0) {
    QObject::property((char *)local_68[0].data);
    cVar3 = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)local_68);
    if (cVar3 != '\0') {
      cp = DD_ItemSeparator;
      local_8c = DD_ItemSelected;
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            ((QPixmapStylePixmap *)local_68,
             (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar1 + 0xf0),&cp);
  QPixmap::QPixmap((QPixmap *)&local_88,(QPixmap *)local_68[0].data);
  QPixmap::~QPixmap((QPixmap *)local_68[0].data);
  local_68[0]._8_4_ = (option->rect).x2;
  local_68[0]._12_4_ = (option->rect).y2;
  local_68[0]._4_4_ = (undefined4)((ulong)*(PrivateShared **)&option->rect >> 0x20);
  uVar2 = local_68[0]._4_4_;
  local_68[0]._0_8_ = *(PrivateShared **)&option->rect;
  iVar4 = QPixmap::height();
  local_68[0]._12_4_ = iVar4 + uVar2 + -1;
  QPainter::drawPixmap(painter,(QRect *)local_68,(QPixmap *)&local_88);
  if (((option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) != 0) {
    local_68[0]._8_4_ = (option->rect).x2;
    local_68[0]._12_4_ = (option->rect).y2;
    local_68[0]._4_4_ = (undefined4)((ulong)*(PrivateShared **)&option->rect >> 0x20);
    uVar2 = local_68[0]._4_4_;
    local_68[0]._0_8_ = *(PrivateShared **)&option->rect;
    iVar4 = QPixmap::height();
    local_68[0]._4_4_ = iVar4 + uVar2;
    drawCachedPixmap(this,local_8c,(QRect *)local_68,painter);
  }
  QPixmap::~QPixmap((QPixmap *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawPanelItemViewItem(const QStyleOption *option, QPainter *painter,
                                         const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    ControlPixmap cp = ID_Separator;
    ControlDescriptor cd = ID_Selected;

    if (widget && widget->property("_pixmap_combobox_list").toBool()) {
        cp = DD_ItemSeparator;
        cd = DD_ItemSelected;
    }

    QPixmap pix = d->pixmaps.value(cp).pixmap;
    QRect rect = option->rect;
    rect.setBottom(rect.top() + pix.height()-1);
    painter->drawPixmap(rect, pix);
    if (option->state & QStyle::State_Selected) {
        rect = option->rect;
        rect.setTop(rect.top() + pix.height());
        drawCachedPixmap(cd, rect, painter);
    }
}